

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkBeamIGAslider.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLinkBeamIGAslider::IntLoadConstraint_C
          (ChLinkBeamIGAslider *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  element_type *peVar1;
  double dVar2;
  undefined1 auVar3 [16];
  int iVar4;
  undefined7 in_register_00000009;
  undefined4 in_register_00000034;
  double dVar5;
  double dVar6;
  ChVector<double> splinepoint;
  ChVector<double> v;
  ChVector<double> res;
  ChMatrix33<double> Arw;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_f0;
  ChQuaternion<double> local_e8;
  undefined1 local_c8 [16];
  double local_b8;
  undefined1 local_a8 [16];
  double local_98;
  ChMatrix33<double> local_70;
  
  iVar4 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                    (c,recovery_clamp,this,CONCAT44(in_register_00000034,off_L),Qc,
                     CONCAT71(in_register_00000009,do_clamp));
  if ((char)iVar4 != '\0') {
    ChQuaternion<double>::operator>>
              (&local_e8,&(this->m_csys).rot,
               &(((this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    ChMatrix33<double>::Set_A_quaternion(&local_70,&local_e8);
    local_e8.m_data[2] = 0.0;
    local_e8.m_data[0] = 0.0;
    local_e8.m_data[1] = 0.0;
    dVar5 = ChElementBeamIGA::GetU1
                      ((this->m_beams).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[this->active_element].
                       super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    dVar6 = ChElementBeamIGA::GetU2
                      ((this->m_beams).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[this->active_element].
                       super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    peVar1 = (this->m_beams).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
             ._M_impl.super__Vector_impl_data._M_start[this->active_element].
             super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar2 = this->tau - dVar5;
    (**(code **)(*(long *)&peVar1->super_ChElementBeam + 0xe8))
              ((dVar2 + dVar2) / (dVar6 - dVar5) + -1.0,peVar1,&local_e8);
    local_f0.m_matrix = &local_70.super_Matrix<double,_3,_3,_1,_3,_3>;
    ChFrame<double>::TransformPointLocalToParent
              ((ChVector<double> *)local_c8,
               (ChFrame<double> *)
               (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&(this->m_csys).pos);
    auVar3._8_8_ = local_e8.m_data[1];
    auVar3._0_8_ = local_e8.m_data[0];
    local_a8 = vsubpd_avx(auVar3,local_c8);
    local_98 = local_e8.m_data[2] - local_b8;
    chrono::operator*(&local_f0,(ChVector<double> *)local_a8);
  }
  return;
}

Assistant:

void ChLinkBeamIGAslider::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                              ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                              const double c,            // a scaling factor
                                              bool do_clamp,             // apply clamping to c*C?
                                              double recovery_clamp      // value for min/max clamping of c*C
) {
    if (!IsActive())
        return;

    ChMatrix33<> Arw(m_csys.rot >> m_body->GetRot());

    ChVector<> splinepoint;
    double u1 = m_beams[this->active_element]->GetU1();
    double u2 = m_beams[this->active_element]->GetU2();
    double eta = (2.0 * (this->tau - u1) / (u2 - u1)) - 1.0;
    m_beams[this->active_element]->EvaluateSectionPoint(eta, splinepoint);
    ////GetLog() << "active_element = " << active_element << "\n";
    ////GetLog() << "tau = " << tau << "\n";
    ////GetLog() << "u1 = " << u1 << "\n";
    ////GetLog() << "u2 = " << u2 << "\n";
    ////GetLog() << "eta = " << eta << "\n";
    ////GetLog() << "point = " << splinepoint << "\n";
    ChVector<> res = Arw.transpose() * (splinepoint - m_body->TransformPointLocalToParent(m_csys.pos));
    ChVector<> cres = res * c;
    ////GetLog() << "res = " << res << "\n";
    if (do_clamp) {
        cres.x() = ChMin(ChMax(cres.x(), -recovery_clamp), recovery_clamp);
        cres.y() = ChMin(ChMax(cres.y(), -recovery_clamp), recovery_clamp);
        cres.z() = ChMin(ChMax(cres.z(), -recovery_clamp), recovery_clamp);
    }
    ////GetLog() << "cres = " << cres << "\n";
    ////Qc(off_L + 0) += cres.x();
    ////Qc(off_L + 0) += cres.y();
    ////Qc(off_L + 1) += cres.z();
}